

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_init(CBB *cbb,size_t initial_capacity)

{
  uint8_t *buf_00;
  uint8_t *buf;
  size_t initial_capacity_local;
  CBB *cbb_local;
  
  CBB_zero(cbb);
  buf_00 = (uint8_t *)OPENSSL_malloc(initial_capacity);
  if ((initial_capacity == 0) || (buf_00 != (uint8_t *)0x0)) {
    cbb_init(cbb,buf_00,initial_capacity,1);
    cbb_local._4_4_ = 1;
  }
  else {
    cbb_local._4_4_ = 0;
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_init(CBB *cbb, size_t initial_capacity) {
  CBB_zero(cbb);

  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(initial_capacity));
  if (initial_capacity > 0 && buf == NULL) {
    return 0;
  }

  cbb_init(cbb, buf, initial_capacity, /*can_resize=*/1);
  return 1;
}